

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_codec.c
# Opt level: O0

int frame_codec_encode_frame
              (FRAME_CODEC_HANDLE frame_codec,uint8_t type,PAYLOAD *payloads,size_t payload_count,
              uchar *type_specific_bytes,uint32_t type_specific_size,
              ON_BYTES_ENCODED on_bytes_encoded,void *callback_context)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  LOGGER_LOG p_Var4;
  uchar *__ptr;
  undefined1 local_bb [3];
  long lStack_b8;
  uchar padding_bytes [3];
  size_t current_pos;
  uchar frame_header [6];
  LOGGER_LOG l_4;
  uchar *encoded_frame;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  size_t frame_body_size;
  size_t frame_size;
  size_t i;
  uint8_t doff;
  uint32_t frame_body_offset;
  uint8_t padding_byte_count;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  FRAME_CODEC_INSTANCE *frame_codec_data;
  int result;
  uint32_t type_specific_size_local;
  uchar *type_specific_bytes_local;
  size_t payload_count_local;
  PAYLOAD *payloads_local;
  uint8_t type_local;
  FRAME_CODEC_HANDLE frame_codec_local;
  
  if ((((frame_codec == (FRAME_CODEC_HANDLE)0x0) || (on_bytes_encoded == (ON_BYTES_ENCODED)0x0)) ||
      ((type_specific_size != 0 && (type_specific_bytes == (uchar *)0x0)))) ||
     (0x3f6 < type_specific_size)) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                ,"frame_codec_encode_frame",0x252,1,
                "Bad arguments: frame_codec = %p, on_bytes_encoded = %p, type_specific_size = %u, type_specific_bytes = %p"
                ,frame_codec,on_bytes_encoded,type_specific_size,type_specific_bytes);
    }
    frame_codec_data._0_4_ = 0x253;
  }
  else if ((payloads == (PAYLOAD *)0x0) && (payload_count != 0)) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                ,"frame_codec_encode_frame",600,1,
                "NULL payloads argument with non-zero payload count");
    }
    frame_codec_data._0_4_ = 0x259;
  }
  else {
    uVar2 = type_specific_size + 9 >> 2;
    l_2 = (LOGGER_LOG)0x0;
    uVar3 = (uVar2 & 0xff) << 2;
    bVar1 = ((char)uVar3 - (char)type_specific_size) - 6;
    for (frame_size = 0;
        ((frame_size < payload_count && (payloads[frame_size].bytes != (uchar *)0x0)) &&
        (payloads[frame_size].length != 0)); frame_size = frame_size + 1) {
      l_2 = l_2 + payloads[frame_size].length;
    }
    if (frame_size < payload_count) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                  ,"frame_codec_encode_frame",0x278,1,"Bad payload entry");
      }
      frame_codec_data._0_4_ = 0x279;
    }
    else {
      p_Var4 = l_2 + uVar3;
      if ((LOGGER_LOG)(ulong)frame_codec->max_frame_size < p_Var4) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                    ,"frame_codec_encode_frame",0x283,1,
                    "Encoded frame size exceeds the maximum allowed frame size");
        }
        frame_codec_data._0_4_ = 0x284;
      }
      else {
        __ptr = (uchar *)malloc((size_t)p_Var4);
        if (__ptr == (uchar *)0x0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                      ,"frame_codec_encode_frame",0x28d,1,"Cannot allocate memory for frame");
          }
          frame_codec_data._0_4_ = 0x28e;
        }
        else {
          lStack_b8 = 0;
          memset(local_bb,0,3);
          current_pos._2_4_ =
               CONCAT13((char)p_Var4,
                        CONCAT12((char)((ulong)p_Var4 >> 8),
                                 CONCAT11((char)((ulong)p_Var4 >> 0x10),
                                          (char)((ulong)p_Var4 >> 0x18))));
          current_pos._6_2_ = CONCAT11(type,(char)uVar2);
          *(undefined4 *)__ptr = current_pos._2_4_;
          *(undefined2 *)(__ptr + 4) = current_pos._6_2_;
          lStack_b8 = lStack_b8 + 6;
          if (type_specific_size != 0) {
            memcpy(__ptr + lStack_b8,type_specific_bytes,(ulong)type_specific_size);
            lStack_b8 = (ulong)type_specific_size + lStack_b8;
          }
          if (bVar1 != 0) {
            memcpy(__ptr + lStack_b8,local_bb,(ulong)bVar1);
            lStack_b8 = (ulong)bVar1 + lStack_b8;
          }
          for (frame_size = 0; frame_size < payload_count; frame_size = frame_size + 1) {
            memcpy(__ptr + lStack_b8,payloads[frame_size].bytes,payloads[frame_size].length);
            lStack_b8 = payloads[frame_size].length + lStack_b8;
          }
          (*on_bytes_encoded)(callback_context,__ptr,(size_t)p_Var4,true);
          free(__ptr);
          frame_codec_data._0_4_ = 0;
        }
      }
    }
  }
  return (int)frame_codec_data;
}

Assistant:

int frame_codec_encode_frame(FRAME_CODEC_HANDLE frame_codec, uint8_t type, const PAYLOAD* payloads, size_t payload_count, const unsigned char* type_specific_bytes, uint32_t type_specific_size, ON_BYTES_ENCODED on_bytes_encoded, void* callback_context)
{
    int result;

    FRAME_CODEC_INSTANCE* frame_codec_data = (FRAME_CODEC_INSTANCE*)frame_codec;

    /* Codes_SRS_FRAME_CODEC_01_044: [If any of arguments `frame_codec` or `on_bytes_encoded` is NULL, `frame_codec_encode_frame` shall return a non-zero value.] */
    if ((frame_codec == NULL) ||
        (on_bytes_encoded == NULL) ||
        /* Codes_SRS_FRAME_CODEC_01_091: [If the argument type_specific_size is greater than 0 and type_specific_bytes is NULL, frame_codec_encode_frame shall return a non-zero value.] */
        ((type_specific_size > 0) && (type_specific_bytes == NULL)) ||
        /* Codes_SRS_FRAME_CODEC_01_092: [If type_specific_size is too big to allow encoding the frame according to the AMQP ISO then frame_codec_encode_frame shall return a non-zero value.] */
        (type_specific_size > MAX_TYPE_SPECIFIC_SIZE))
    {
        LogError("Bad arguments: frame_codec = %p, on_bytes_encoded = %p, type_specific_size = %u, type_specific_bytes = %p",
            frame_codec, on_bytes_encoded, (unsigned int)type_specific_size, type_specific_bytes);
        result = MU_FAILURE;
    }
    else if ((payloads == NULL) && (payload_count > 0))
    {
        /* Codes_SRS_FRAME_CODEC_01_107: [If the argument `payloads` is NULL and `payload_count` is non-zero, `frame_codec_encode_frame` shall return a non-zero value.]*/
        LogError("NULL payloads argument with non-zero payload count");
        result = MU_FAILURE;
    }
    else
    {
        /* round up to the 4 bytes for doff */
        /* Codes_SRS_FRAME_CODEC_01_067: [The value of the data offset is an unsigned, 8-bit integer specifying a count of 4-byte words.] */
        /* Codes_SRS_FRAME_CODEC_01_068: [Due to the mandatory 8-byte frame header, the frame is malformed if the value is less than 2.] */
        uint8_t padding_byte_count;
        uint32_t frame_body_offset = type_specific_size + 6;
        uint8_t doff = (uint8_t)((frame_body_offset + 3) / 4);
        size_t i;
        size_t frame_size;
        size_t frame_body_size = 0;
        frame_body_offset = doff * 4;
        padding_byte_count = (uint8_t)(frame_body_offset - type_specific_size - 6);

        for (i = 0; i < payload_count; i++)
        {
            /* Codes_SRS_FRAME_CODEC_01_110: [ If the `bytes` member of a payload entry is NULL, `frame_codec_encode_frame` shall fail and return a non-zero value. ] */
            if ((payloads[i].bytes == NULL) ||
                /* Codes_SRS_FRAME_CODEC_01_111: [ If the `length` member of a payload entry is 0, `frame_codec_encode_frame` shall fail and return a non-zero value. ] */
                (payloads[i].length == 0))
            {
                break;
            }

            frame_body_size += payloads[i].length;
        }

        if (i < payload_count)
        {
            LogError("Bad payload entry");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_FRAME_CODEC_01_063: [This is an unsigned 32-bit integer that MUST contain the total frame size of the frame header, extended header, and frame body.] */
            frame_size = frame_body_size + frame_body_offset;

            if (frame_size > frame_codec_data->max_frame_size)
            {
                /* Codes_SRS_FRAME_CODEC_01_095: [If the frame_size needed for the frame is bigger than the maximum frame size, frame_codec_encode_frame shall fail and return a non-zero value.] */
                LogError("Encoded frame size exceeds the maximum allowed frame size");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_FRAME_CODEC_01_108: [ Memory shall be allocated to hold the entire frame. ]*/
                unsigned char* encoded_frame = (unsigned char*)malloc(frame_size);
                if (encoded_frame == NULL)
                {
                    /* Codes_SRS_FRAME_CODEC_01_109: [ If allocating memory fails, `frame_codec_encode_frame` shall fail and return a non-zero value. ]*/
                    LogError("Cannot allocate memory for frame");
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_FRAME_CODEC_01_042: [frame_codec_encode_frame encodes the header, type specific bytes and frame payload of a frame that has frame_payload_size bytes.]*/
                    /* Codes_SRS_FRAME_CODEC_01_055: [Frames are divided into three distinct areas: a fixed width frame header, a variable width extended header, and a variable width frame body.] */
                    /* Codes_SRS_FRAME_CODEC_01_056: [frame header The frame header is a fixed size (8 byte) structure that precedes each frame.] */
                    /* Codes_SRS_FRAME_CODEC_01_057: [The frame header includes mandatory information necessary to parse the rest of the frame including size and type information.] */
                    /* Codes_SRS_FRAME_CODEC_01_058: [extended header The extended header is a variable width area preceding the frame body.] */
                    /* Codes_SRS_FRAME_CODEC_01_059: [This is an extension point defined for future expansion.] */
                    /* Codes_SRS_FRAME_CODEC_01_060: [The treatment of this area depends on the frame type.]*/
                    /* Codes_SRS_FRAME_CODEC_01_062: [SIZE Bytes 0-3 of the frame header contain the frame size.] */
                    /* Codes_SRS_FRAME_CODEC_01_063: [This is an unsigned 32-bit integer that MUST contain the total frame size of the frame header, extended header, and frame body.] */
                    /* Codes_SRS_FRAME_CODEC_01_064: [The frame is malformed if the size is less than the size of the frame header (8 bytes).] */
                    unsigned char frame_header[6];
                    size_t current_pos = 0;
                    /* Codes_SRS_FRAME_CODEC_01_090: [If the type_specific_size - 2 does not divide by 4, frame_codec_encode_frame shall pad the type_specific bytes with zeroes so that type specific data is according to the AMQP ISO.] */
                    unsigned char padding_bytes[] = { 0x00, 0x00, 0x00 };

                    frame_header[0] = (frame_size >> 24) & 0xFF;
                    frame_header[1] = (frame_size >> 16) & 0xFF;
                    frame_header[2] = (frame_size >> 8) & 0xFF;
                    frame_header[3] = frame_size & 0xFF;
                    /* Codes_SRS_FRAME_CODEC_01_065: [DOFF Byte 4 of the frame header is the data offset.] */
                    frame_header[4] = doff;
                    /* Codes_SRS_FRAME_CODEC_01_069: [TYPE Byte 5 of the frame header is a type code.] */
                    frame_header[5] = type;

                    (void)memcpy(encoded_frame, frame_header, sizeof(frame_header));
                    current_pos += sizeof(frame_header);

                    if (type_specific_size > 0)
                    {
                        (void)memcpy(encoded_frame + current_pos, type_specific_bytes, type_specific_size);
                        current_pos += type_specific_size;
                    }

                    /* send padding bytes */
                    if (padding_byte_count > 0)
                    {
                        (void)memcpy(encoded_frame + current_pos, padding_bytes, padding_byte_count);
                        current_pos += padding_byte_count;
                    }

                    /* Codes_SRS_FRAME_CODEC_01_106: [All payloads shall be encoded in order as part of the frame.] */
                    for (i = 0; i < payload_count; i++)
                    {
                        (void)memcpy(encoded_frame + current_pos, payloads[i].bytes, payloads[i].length);
                        current_pos += payloads[i].length;
                    }

                    /* Codes_SRS_FRAME_CODEC_01_088: [Encoded bytes shall be passed to the `on_bytes_encoded` callback in a single call, while setting the `encode complete` argument to true.] */
                    on_bytes_encoded(callback_context, encoded_frame, frame_size, true);

                    free(encoded_frame);

                    /* Codes_SRS_FRAME_CODEC_01_043: [On success it shall return 0.] */
                    result = 0;
                }
            }
        }
    }

    return result;
}